

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_collision_bench.cc
# Opt level: O2

void RandomCommand(char **s)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar2 = random();
  iVar1 = (int)uVar2;
  pcVar3 = (char *)operator_new__((long)(iVar1 + 1));
  *s = pcVar3;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < iVar1) {
    uVar6 = uVar2 & 0xffffffff;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    lVar4 = random();
    (*s)[uVar5] = (char)lVar4;
  }
  (*s)[iVar1] = '\0';
  return;
}

Assistant:

void RandomCommand(char** s) {
  int len = random(5, 100);
  *s = new char[len+1];
  for (int i = 0; i < len; ++i)
    (*s)[i] = (char)random(32, 127);
  (*s)[len] = '\0';
}